

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objsetign(mcmcxdef *mctx,objnum objn)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  ushort in_SI;
  undefined8 *in_RDI;
  objnum in_stack_0000000e;
  mcmcxdef *in_stack_00000010;
  prpdef *p1;
  int indexed;
  int cnt;
  int statcnt;
  prpdef *p;
  prpdef *mut;
  objdef *objptr;
  mcmon in_stack_ffffffffffffff8e;
  mcmcxdef *in_stack_ffffffffffffff90;
  mcmcxdef *in_stack_ffffffffffffff98;
  int local_30;
  uint local_2c;
  uchar *local_28;
  uchar *local_20;
  
  puVar7 = mcmlck(in_stack_ffffffffffffff98,(mcmon)((ulong)in_stack_ffffffffffffff90 >> 0x30));
  uVar1 = osrp2(puVar7 + 4);
  uVar2 = osrp2(puVar7 + 2);
  uVar3 = osrp2(puVar7 + 0xc);
  local_20 = puVar7 + (int)(uVar3 & 0xffff);
  uVar3 = osrp2(puVar7 + 6);
  uVar4 = osrp2(puVar7 + 10);
  local_30 = (uVar3 & 0xffff) - (uVar4 & 0xffff);
  do {
    if (local_30 == 0) {
      lVar9 = *(long *)(*(long *)*in_RDI +
                       (long)((int)(uint)*(ushort *)
                                          (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                          (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
              (long)(int)(*(ushort *)
                           (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                           (long)(int)(in_SI & 0xff) * 2) & 0xff) * 0x20;
      *(ushort *)(lVar9 + 0x14) = *(ushort *)(lVar9 + 0x14) | 1;
      mcmunlck(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e);
      if ((uVar2 & 2) != 0) {
        objindx(in_stack_00000010,in_stack_0000000e);
      }
      return;
    }
    local_2c = osrp2(puVar7 + 10);
    local_28 = puVar7 + (long)(int)((uVar1 & 0xffff) << 1) + 0xe;
    for (local_2c = local_2c & 0xffff; local_2c != 0; local_2c = local_2c - 1) {
      iVar5 = osrp2(local_28);
      iVar6 = osrp2(local_20);
      if (iVar5 == iVar6) {
        local_28[5] = local_28[5] | 2;
        break;
      }
      puVar8 = local_28 + 6;
      iVar5 = osrp2(local_28 + 3);
      local_28 = puVar8 + iVar5;
    }
    in_stack_ffffffffffffff90 = (mcmcxdef *)(local_20 + 6);
    iVar5 = osrp2(local_20 + 3);
    local_20 = (uchar *)((long)in_stack_ffffffffffffff90->mcmcxmtb + (long)iVar5 + -0x30);
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

void objsetign(mcmcxdef *mctx, objnum objn)
{
    objdef *objptr;
    prpdef *mut;
    prpdef *p;
    int     statcnt;
    int     cnt;
    int     indexed;
    prpdef *p1;
    
    objptr = (objdef *)mcmlck(mctx, (mcmon)objn);
    p1 = objprp(objptr);
    indexed = objflg(objptr) & OBJFINDEX;

    /* go through mutables, and set ignore on duplicates in non-mutables */
    for (mut = (prpdef *)(objptr + objrst(objptr)),
         cnt = objnprop(objptr) - objstat(objptr) ; cnt ;
         mut = objpnxt(mut), --cnt)
    {
        for (p = p1, statcnt = objstat(objptr) ; statcnt ;
             p = objpnxt(p), --statcnt)
        {
            /* if this static prop matches a mutable prop, ignore it */
            if (prpprop(p) == prpprop(mut))
            {
                prpflg(p) |= PRPFIGN;
                break;
            }
        }
    }
    
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
    if (indexed) objindx(mctx, objn);
}